

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fiosav_voc_cb(void *ctx0,vocdef *voc,vocwdef *vocw)

{
  size_t sVar1;
  long in_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  char buf [10];
  fiosav_cb_ctx *ctx;
  undefined1 local_2a;
  undefined1 local_29;
  undefined1 auStack_28 [2];
  undefined1 auStack_26 [2];
  undefined1 auStack_24 [4];
  undefined4 *local_20;
  long local_18;
  long local_10;
  
  if (((*(byte *)(in_RDX + 7) & 4) != 0) || ((*(byte *)(in_RDX + 7) & 8) != 0)) {
    local_2a = *(undefined1 *)(in_RDX + 6);
    local_29 = *(undefined1 *)(in_RDX + 7);
    local_20 = in_RDI;
    local_18 = in_RDX;
    local_10 = in_RSI;
    oswp2(auStack_28,(uint)*(byte *)(in_RSI + 8));
    oswp2(auStack_26,(uint)*(byte *)(local_10 + 9));
    oswp2(auStack_24,(uint)*(ushort *)(local_18 + 4));
    sVar1 = fwrite(&local_2a,8,1,*(FILE **)(local_20 + 2));
    if (sVar1 != 1) {
      *local_20 = 1;
    }
    sVar1 = fwrite((void *)(local_10 + 0x10),
                   (long)(int)((uint)*(byte *)(local_10 + 8) + (uint)*(byte *)(local_10 + 9)),1,
                   *(FILE **)(local_20 + 2));
    if (sVar1 != 1) {
      *local_20 = 1;
    }
  }
  return;
}

Assistant:

static void fiosav_voc_cb(void *ctx0, vocdef *voc, vocwdef *vocw)
{
    struct fiosav_cb_ctx *ctx = (struct fiosav_cb_ctx *)ctx0;
    char buf[10];
    
    /* if the word was dynamically allocated or deleted, save it */
    if ((vocw->vocwflg & VOCFNEW) || (vocw->vocwflg & VOCFDEL))
    {
        /* write the header information */
        buf[0] = vocw->vocwtyp;
        buf[1] = vocw->vocwflg;
        oswp2(buf+2, voc->voclen);
        oswp2(buf+4, voc->vocln2);
        oswp2(buf+6, vocw->vocwobj);
        if (osfwb(ctx->fp, buf, 8)) ctx->err = TRUE;

        /* write the words */
        if (osfwb(ctx->fp, voc->voctxt, voc->voclen + voc->vocln2))
            ctx->err = TRUE;
    }
}